

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-ni.c
# Opt level: O0

void aes_sdctr_ni(ssh_cipher *ciph,void *vblk,int blklen,aes_ni_fn encrypt)

{
  uint8_t *puVar1;
  ulong extraout_XMM0_Qa;
  ssh_cipheralg *extraout_XMM0_Qa_00;
  ulong extraout_XMM0_Qb;
  ssh_cipheralg *extraout_XMM0_Qb_00;
  __m128i alVar3;
  __m128i v;
  __m128i alVar4;
  __m128i output;
  __m128i input;
  __m128i keystream;
  __m128i counter;
  uint8_t *finish;
  uint8_t *blk;
  aes_ni_context *ctx;
  aes_ni_fn encrypt_local;
  int blklen_local;
  void *vblk_local;
  ssh_cipher *ciph_local;
  ssh_cipher *psVar2;
  
  puVar1 = (uint8_t *)((long)vblk + (long)blklen);
  psVar2 = ciph;
  for (finish = (uint8_t *)vblk; finish < puVar1; finish = finish + 0x10) {
    alVar4[1] = (longlong)vblk;
    alVar4[0] = (longlong)psVar2;
    alVar4 = aes_ni_sdctr_reverse(alVar4);
    alVar3[1] = (longlong)vblk;
    alVar3[0] = (longlong)(ciph + -0x3f);
    psVar2 = ciph + -0x3f;
    (*encrypt)(alVar3,alVar4[1]);
    *(ulong *)finish = *(ulong *)finish ^ extraout_XMM0_Qa;
    *(ulong *)(finish + 8) = *(ulong *)(finish + 8) ^ extraout_XMM0_Qb;
    v[1] = (longlong)vblk;
    v[0] = (longlong)psVar2;
    aes_ni_sdctr_increment(v);
    ciph[-3].vt = extraout_XMM0_Qa_00;
    ciph[-2].vt = extraout_XMM0_Qb_00;
  }
  return;
}

Assistant:

static inline void aes_sdctr_ni(
    ssh_cipher *ciph, void *vblk, int blklen, aes_ni_fn encrypt)
{
    aes_ni_context *ctx = container_of(ciph, aes_ni_context, ciph);

    for (uint8_t *blk = (uint8_t *)vblk, *finish = blk + blklen;
         blk < finish; blk += 16) {
        __m128i counter = aes_ni_sdctr_reverse(ctx->iv);
        __m128i keystream = encrypt(counter, ctx->keysched_e);
        __m128i input = _mm_loadu_si128((const __m128i *)blk);
        __m128i output = _mm_xor_si128(input, keystream);
        _mm_storeu_si128((__m128i *)blk, output);
        ctx->iv = aes_ni_sdctr_increment(ctx->iv);
    }
}